

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O0

string_view slang::DiagnosticClient::getSeverityString(DiagnosticSeverity severity)

{
  uint in_EDI;
  string_view sVar1;
  
  sVar1 = (string_view)(*(code *)(&DAT_00ae68e0 + *(int *)(&DAT_00ae68e0 + (ulong)in_EDI * 4)))();
  return sVar1;
}

Assistant:

std::string_view DiagnosticClient::getSeverityString(DiagnosticSeverity severity) {
    switch (severity) {
        case DiagnosticSeverity::Ignored:
            return "ignored";
        case DiagnosticSeverity::Note:
            return "note";
        case DiagnosticSeverity::Warning:
            return "warning";
        case DiagnosticSeverity::Error:
            return "error";
        case DiagnosticSeverity::Fatal:
            return "fatal error";
    }
    SLANG_UNREACHABLE;
}